

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O3

void coda_detection_rule_delete(coda_detection_rule *detection_rule)

{
  int iVar1;
  coda_detection_rule_entry **__ptr;
  long lVar2;
  
  __ptr = detection_rule->entry;
  if (__ptr != (coda_detection_rule_entry **)0x0) {
    iVar1 = detection_rule->num_entries;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (detection_rule->entry[lVar2] != (coda_detection_rule_entry *)0x0) {
          coda_detection_rule_entry_delete(detection_rule->entry[lVar2]);
          iVar1 = detection_rule->num_entries;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      __ptr = detection_rule->entry;
    }
    free(__ptr);
  }
  free(detection_rule);
  return;
}

Assistant:

void coda_detection_rule_delete(coda_detection_rule *detection_rule)
{
    if (detection_rule->entry != NULL)
    {
        int i;

        for (i = 0; i < detection_rule->num_entries; i++)
        {
            if (detection_rule->entry[i] != NULL)
            {
                coda_detection_rule_entry_delete(detection_rule->entry[i]);
            }
        }
        free(detection_rule->entry);
    }
    free(detection_rule);
}